

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O3

bool __thiscall
cmWhileCommand::InvokeInitialPass
          (cmWhileCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *param_2)

{
  pointer pcVar1;
  pointer pcVar2;
  cmWhileFunctionBlocker *this_00;
  string local_48;
  
  pcVar1 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pcVar2 == pcVar1) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    this_00 = (cmWhileFunctionBlocker *)operator_new(0x90);
    cmWhileFunctionBlocker::cmWhileFunctionBlocker(this_00,(this->super_cmCommand).Makefile);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::operator=
              (&this_00->Args,args);
    cmMakefile::AddFunctionBlocker((this->super_cmCommand).Makefile,(cmFunctionBlocker *)this_00);
  }
  return pcVar2 != pcVar1;
}

Assistant:

bool cmWhileCommand
::InvokeInitialPass(const std::vector<cmListFileArgument>& args,
                    cmExecutionStatus &)
{
  if(args.size() < 1)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // create a function blocker
  cmWhileFunctionBlocker *f = new cmWhileFunctionBlocker(this->Makefile);
  f->Args = args;
  this->Makefile->AddFunctionBlocker(f);

  return true;
}